

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPTransporter.h
# Opt level: O2

void __thiscall jaegertracing::utils::UDPTransporter::emitBatch(UDPTransporter *this,Batch *batch)

{
  AgentClient *pAVar1;
  element_type *peVar2;
  void *__buf;
  ssize_t sVar3;
  logic_error *this_00;
  ostream *poVar4;
  system_error *this_01;
  int *piVar5;
  error_category *__ecat;
  int iVar6;
  ulong uVar7;
  string local_1c0;
  ostringstream oss;
  
  apache::thrift::transport::TMemoryBuffer::resetBuffer
            ((this->_buffer).
             super___shared_ptr<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  pAVar1 = (this->_client)._M_t.
           super___uniq_ptr_impl<jaegertracing::agent::thrift::AgentClient,_std::default_delete<jaegertracing::agent::thrift::AgentClient>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::agent::thrift::AgentClient_*,_std::default_delete<jaegertracing::agent::thrift::AgentClient>_>
           .super__Head_base<0UL,_jaegertracing::agent::thrift::AgentClient_*,_false>._M_head_impl;
  (**(code **)(*(long *)pAVar1 + 0x18))(pAVar1,batch);
  peVar2 = (this->_buffer).
           super___shared_ptr<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  __buf = *(void **)(peVar2 + 8);
  uVar7 = *(long *)(peVar2 + 0x18) - (long)__buf;
  iVar6 = (int)uVar7;
  if ((this->super_Transport)._maxPacketSize < iVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Data does not fit within one UDP packet, size ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,", max ");
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)poVar4,(this->super_Transport)._maxPacketSize);
    poVar4 = std::operator<<(poVar4,", spans ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::logic_error::logic_error(this_00,(string *)&local_1c0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  sVar3 = send((this->super_Transport)._socket._handle,__buf,uVar7 & 0xffffffff,0);
  if (iVar6 == (int)sVar3) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"Failed to write message, numWritten=");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4,", size=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  this_01 = (system_error *)__cxa_allocate_exception(0x20);
  piVar5 = __errno_location();
  iVar6 = *piVar5;
  std::__cxx11::stringbuf::str();
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_01,iVar6,__ecat,&local_1c0);
  __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void emitBatch(const thrift::Batch& batch) override
    {
        _buffer->resetBuffer();
        _client->emitBatch(batch);
        uint8_t* data = nullptr;
        uint32_t size = 0;
        _buffer->getBuffer(&data, &size);
        if (static_cast<int>(size) > _maxPacketSize) {
            std::ostringstream oss;
            oss << "Data does not fit within one UDP packet"
                   ", size "
                << size << ", max " << _maxPacketSize << ", spans "
                << batch.spans.size();
            throw std::logic_error(oss.str());
        }
        const auto numWritten = ::send(_socket.handle(), reinterpret_cast<char*>(data), sizeof(uint8_t) * size, 0);
        if (static_cast<unsigned>(numWritten) != size) {
            std::ostringstream oss;
            oss << "Failed to write message"
                   ", numWritten="
                << numWritten << ", size=" << size;
            throw std::system_error(errno, std::system_category(), oss.str());
        }
    }